

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExportFileGenerator.cxx
# Opt level: O3

bool __thiscall cmExportFileGenerator::GenerateImportFile(cmExportFileGenerator *this)

{
  char *pcVar1;
  int iVar2;
  cmGeneratedFileStream *this_00;
  ostream *poVar3;
  undefined1 uVar4;
  string se;
  ostringstream e;
  long *local_1d8;
  long local_1d0;
  long local_1c8 [2];
  string local_1b8;
  undefined1 local_198 [16];
  _func_int *local_188 [12];
  ios_base local_128 [264];
  
  if (this->AppendMode == true) {
    pcVar1 = (this->MainImportFile)._M_dataplus._M_p;
    this_00 = (cmGeneratedFileStream *)operator_new(0x200);
    std::ofstream::ofstream(this_00,pcVar1,_S_app);
  }
  else {
    this_00 = (cmGeneratedFileStream *)operator_new(0x268);
    cmGeneratedFileStream::cmGeneratedFileStream(this_00,&this->MainImportFile,true,None);
    cmGeneratedFileStream::SetCopyIfDifferent(this_00,true);
  }
  if (((&(this_00->super_ofstream).super_basic_ostream<char,_std::char_traits<char>_>.field_0x20)
       [(long)(this_00->super_ofstream).super_basic_ostream<char,_std::char_traits<char>_>.
              _vptr_basic_ostream[-3]] & 5) == 0) {
    (*this->_vptr_cmExportFileGenerator[2])(this,this_00);
    local_198._0_8_ = local_188;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_198,"");
    (*this->_vptr_cmExportFileGenerator[4])(this,this_00,local_198);
    if ((_func_int **)local_198._0_8_ != local_188) {
      operator_delete((void *)local_198._0_8_,(ulong)(local_188[0] + 1));
    }
    iVar2 = (*this->_vptr_cmExportFileGenerator[0xc])(this,this_00);
    uVar4 = (undefined1)iVar2;
    (*this->_vptr_cmExportFileGenerator[5])(this,this_00);
    (*this->_vptr_cmExportFileGenerator[3])(this,this_00);
  }
  else {
    cmsys::SystemTools::GetLastSystemError_abi_cxx11_();
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_198);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_198,"cannot write to file \"",0x16);
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)local_198,(this->MainImportFile)._M_dataplus._M_p,
                        (this->MainImportFile)._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\": ",3);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,(char *)local_1d8,local_1d0);
    std::__cxx11::stringbuf::str();
    cmSystemTools::Error(&local_1b8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1b8._M_dataplus._M_p != &local_1b8.field_2) {
      operator_delete(local_1b8._M_dataplus._M_p,local_1b8.field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_198);
    std::ios_base::~ios_base(local_128);
    if (local_1d8 != local_1c8) {
      operator_delete(local_1d8,local_1c8[0] + 1);
    }
    uVar4 = 0;
  }
  (*(this_00->super_ofstream).super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream
    [1])(this_00);
  return (bool)uVar4;
}

Assistant:

bool cmExportFileGenerator::GenerateImportFile()
{
  // Open the output file to generate it.
  std::unique_ptr<cmsys::ofstream> foutPtr;
  if (this->AppendMode) {
    // Open for append.
    auto openmodeApp = std::ios::app;
    foutPtr = cm::make_unique<cmsys::ofstream>(this->MainImportFile.c_str(),
                                               openmodeApp);
  } else {
    // Generate atomically and with copy-if-different.
    std::unique_ptr<cmGeneratedFileStream> ap(
      new cmGeneratedFileStream(this->MainImportFile, true));
    ap->SetCopyIfDifferent(true);
    foutPtr = std::move(ap);
  }
  if (!foutPtr || !*foutPtr) {
    std::string se = cmSystemTools::GetLastSystemError();
    std::ostringstream e;
    e << "cannot write to file \"" << this->MainImportFile << "\": " << se;
    cmSystemTools::Error(e.str());
    return false;
  }
  std::ostream& os = *foutPtr;

  // Start with the import file header.
  this->GeneratePolicyHeaderCode(os);
  this->GenerateImportHeaderCode(os);

  // Create all the imported targets.
  bool result = this->GenerateMainFile(os);

  // End with the import file footer.
  this->GenerateImportFooterCode(os);
  this->GeneratePolicyFooterCode(os);

  return result;
}